

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_2::anon_unknown_0::LineBufferTask::execute(LineBufferTask *this)

{
  int iVar1;
  int iVar2;
  LineBuffer *pLVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Data *pDVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  PixelType *pPVar13;
  int y;
  uint uVar14;
  bool bVar15;
  char *readPtr;
  LineBufferTask *local_38;
  
  pLVar3 = this->_lineBuffer;
  if (pLVar3->uncompressedData == (char *)0x0) {
    pDVar9 = this->_ifd;
    iVar1 = *(int *)((long)&(pDVar9->frameBuffer)._sampleCounts.base + 4);
    iVar6 = (int)(pDVar9->frameBuffer)._sampleCounts.xStride;
    iVar2 = (int)pLVar3->unpackedDataSize;
    if (iVar6 < iVar2) {
      iVar2 = iVar6;
    }
    uVar10 = 0;
    for (lVar11 = (long)(*(int *)((long)&pLVar3->packedDataSize + 4) - iVar1);
        lVar11 <= iVar2 - iVar1; lVar11 = lVar11 + 1) {
      uVar10 = uVar10 + *(long *)(*(long *)&pDVar9->lineOrder + lVar11 * 8);
    }
    if ((*(long **)&pLVar3->minY == (long *)0x0) ||
       (uVar10 <= (ulong)(long)(int)pLVar3->packedDataSize)) {
      *(undefined4 *)&pLVar3->compressor = 1;
      pLVar3->uncompressedData = pLVar3->buffer;
    }
    else {
      uVar5 = (**(code **)(**(long **)&pLVar3->minY + 0x18))();
      pLVar3 = this->_lineBuffer;
      *(undefined4 *)&pLVar3->compressor = uVar5;
      uVar5 = (**(code **)(**(long **)&pLVar3->minY + 0x30))
                        (*(long **)&pLVar3->minY,pLVar3->buffer,(int)pLVar3->packedDataSize,
                         *(undefined4 *)((long)&pLVar3->packedDataSize + 4));
      *(undefined4 *)&this->_lineBuffer->packedDataSize = uVar5;
    }
  }
  pDVar9 = this->_ifd;
  iVar1 = this->_scanLineMax + 1;
  iVar2 = this->_scanLineMin;
  iVar6 = iVar2 + -1;
  bVar15 = (pDVar9->frameBuffer)._sampleCounts.type == UINT;
  local_38 = this;
  if (!bVar15) {
    iVar2 = this->_scanLineMax;
    iVar1 = iVar6;
  }
  for (; iVar2 != iVar1; iVar2 = iVar2 + (bVar15 - 1) + (uint)bVar15) {
    readPtr = this->_lineBuffer->uncompressedData +
              (pDVar9->lineOffsets).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [(long)iVar2 - (long)*(int *)((long)&(pDVar9->frameBuffer)._sampleCounts.base + 4)];
    uVar14 = 0;
    while( true ) {
      lVar11 = *(long *)&pDVar9->fileIsComplete;
      if ((ulong)(((long)(pDVar9->bytesPerLine).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start - lVar11) / 0x38) <= (ulong)uVar14) break;
      lVar12 = (ulong)uVar14 * 0x38;
      iVar6 = Imath_3_2::modp(iVar2,*(int *)(lVar11 + 0x24 + lVar12));
      if (iVar6 == 0) {
        pPVar13 = (PixelType *)(lVar11 + lVar12);
        iVar6 = Imath_3_2::divp(*(int *)&(this->_ifd->frameBuffer)._sampleCounts.field_0x4,
                                pPVar13[8]);
        iVar7 = Imath_3_2::divp(*(int *)&(this->_ifd->frameBuffer)._sampleCounts.base,pPVar13[8]);
        if (*(byte *)((long)pPVar13 + 0x29) == 1) {
          skipChannel(&readPtr,pPVar13[1],(long)((iVar7 - iVar6) + 1));
        }
        else {
          uVar4 = *(undefined8 *)(pPVar13 + 2);
          iVar8 = Imath_3_2::divp(iVar2,pPVar13[9]);
          this = local_38;
          lVar11 = (long)iVar8 * *(undefined8 *)(pPVar13 + 6) + uVar4;
          uVar4 = *(undefined8 *)(pPVar13 + 4);
          copyIntoFrameBuffer(&readPtr,(char *)((long)iVar6 * uVar4 + lVar11),
                              (char *)((long)iVar7 * uVar4 + lVar11),uVar4,SUB41(pPVar13[10],0),
                              *(double *)(pPVar13 + 0xc),
                              *(Format *)&local_38->_lineBuffer->compressor,*pPVar13,pPVar13[1]);
        }
      }
      uVar14 = uVar14 + 1;
      pDVar9 = this->_ifd;
    }
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //

        if (_lineBuffer->uncompressedData == 0)
        {
            uint64_t uncompressedSize = 0;
            int      maxY             = min (_lineBuffer->maxY, _ifd->maxY);

            for (int i = _lineBuffer->minY - _ifd->minY; i <= maxY - _ifd->minY;
                 ++i)
            {
                uncompressedSize += (int) _ifd->bytesPerLine[i];
            }

            //
            // Create the compressor everytime when we want to use it,
            // because we don't know maxBytesPerLine beforehand.
            // (TODO) optimize this. don't do this every time.
            //

            if (_lineBuffer->compressor != 0) delete _lineBuffer->compressor;
            uint64_t maxBytesPerLine = 0;
            for (int i = _lineBuffer->minY - _ifd->minY; i <= maxY - _ifd->minY;
                 ++i)
            {
                if (_ifd->bytesPerLine[i] > maxBytesPerLine)
                    maxBytesPerLine = _ifd->bytesPerLine[i];
            }
            _lineBuffer->compressor = newCompressor (
                _ifd->header.compression (), maxBytesPerLine, _ifd->header);

            if (_lineBuffer->compressor &&
                _lineBuffer->packedDataSize < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format ();

                _lineBuffer->packedDataSize =
                    _lineBuffer->compressor->uncompress (
                        _lineBuffer->buffer,
                        static_cast<int> (_lineBuffer->packedDataSize),
                        _lineBuffer->minY,
                        _lineBuffer->uncompressedData);

                if (_lineBuffer->unpackedDataSize !=
                    _lineBuffer->packedDataSize)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Incorrect size for decompressed data. Expected "
                            << _lineBuffer->unpackedDataSize << " got "
                            << _lineBuffer->packedDataSize << " bytes");
                }
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //

                _lineBuffer->format           = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;

                if (_lineBuffer->packedDataSize != maxBytesPerLine)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Incorrect size for uncompressed data. Expected "
                            << maxBytesPerLine << " got "
                            << _lineBuffer->packedDataSize << " bytes");
                }
            }
        }

        int yStart, yStop, dy;

        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop  = _scanLineMax + 1;
            dy     = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop  = _scanLineMin - 1;
            dy     = -1;
        }

        for (int y = yStart; y != yStop; y += dy)
        {
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //

            const char* readPtr = _lineBuffer->uncompressedData +
                                  _ifd->offsetInLineBuffer[y - _ifd->minY];

            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size (); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
                // (the scan line contains data only if y % ySampling == 0).
                //

                InSliceInfo& slice = *_ifd->slices[i];

                if (modp (y, slice.ySampling) != 0) continue;

                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (
                        readPtr,
                        slice.typeInFile,
                        _ifd->lineSampleCount[y - _ifd->minY]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    int width = (_ifd->maxX - _ifd->minX + 1);

                    ptrdiff_t base;

                    if (_ifd->bigFile)
                    {
                        base = reinterpret_cast<ptrdiff_t> (
                            &_lineBuffer->_tempCountBuffer[0][0]);
                        base -= sizeof (unsigned int) * _ifd->minX;
                        base -= sizeof (unsigned int) *
                                static_cast<ptrdiff_t> (_lineBuffer->minY) *
                                static_cast<ptrdiff_t> (width);
                    }
                    else
                    {
                        base = reinterpret_cast<ptrdiff_t> (
                            &_ifd->sampleCount[0][0]);
                        base -= sizeof (unsigned int) * _ifd->minX;
                        base -= sizeof (unsigned int) *
                                static_cast<ptrdiff_t> (_ifd->minY) *
                                static_cast<ptrdiff_t> (width);
                    }

                    copyIntoDeepFrameBuffer (
                        readPtr,
                        slice.base,
                        reinterpret_cast<char*> (base),
                        sizeof (unsigned int) * 1,
                        sizeof (unsigned int) * width,
                        y,
                        _ifd->minX,
                        _ifd->maxX,
                        0,
                        0,
                        0,
                        0,
                        slice.sampleStride,
                        slice.xPointerStride,
                        slice.yPointerStride,
                        slice.fill,
                        slice.fillValue,
                        _lineBuffer->format,
                        slice.typeInFrameBuffer,
                        slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = e.what ();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}